

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c3dtypes.h
# Opt level: O2

void __thiscall EventInfo::EventInfo(EventInfo *this)

{
  allocator<char> local_12;
  allocator<char> local_11;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)this,"",&local_11);
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->context,"",&local_12);
  this->time_minutes = 0.0;
  this->time_seconds = 0.0;
  return;
}

Assistant:

EventInfo() :
		label (""),
		context (""),
		time_minutes (0.f),
		time_seconds (0.f)
	{}